

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::DefaultPrintTo<std::vector<int,std::allocator<int>>>
               (undefined8 *param_1,ostream *param_2)

{
  long lVar1;
  int *value;
  
  std::operator<<(param_2,'{');
  value = (int *)*param_1;
  lVar1 = 0;
  do {
    if (value == (int *)param_1[1]) {
      if (lVar1 != 0) {
LAB_0010e90c:
        std::operator<<(param_2,' ');
      }
      std::operator<<(param_2,'}');
      return;
    }
    if ((lVar1 != 0) && (std::operator<<(param_2,','), lVar1 == 0x20)) {
      std::operator<<(param_2," ...");
      goto LAB_0010e90c;
    }
    std::operator<<(param_2,' ');
    testing_internal::DefaultPrintNonContainerTo<int>(value,param_2);
    value = value + 1;
    lVar1 = lVar1 + 1;
  } while( true );
}

Assistant:

void DefaultPrintTo(WrapPrinterType<kPrintContainer> /* dummy */,
                    const C& container, ::std::ostream* os) {
  const size_t kMaxCount = 32;  // The maximum number of elements to print.
  *os << '{';
  size_t count = 0;
  for (typename C::const_iterator it = container.begin();
       it != container.end(); ++it, ++count) {
    if (count > 0) {
      *os << ',';
      if (count == kMaxCount) {  // Enough has been printed.
        *os << " ...";
        break;
      }
    }
    *os << ' ';
    // We cannot call PrintTo(*it, os) here as PrintTo() doesn't
    // handle *it being a native array.
    internal::UniversalPrint(*it, os);
  }

  if (count > 0) {
    *os << ' ';
  }
  *os << '}';
}